

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_to_bgr.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  char *pcVar1;
  long lVar2;
  initializer_list<cv::Mat> __l;
  allocator<char> local_671;
  undefined8 local_670 [4];
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  _Vector_base<int,_std::allocator<int>_> local_638;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_620;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string data_dir;
  Vec2i local_528;
  Mat viz;
  Mat local_4c0 [96];
  Mat local_460 [160];
  Mat depth_normalized;
  _InputArray local_360;
  Mat depth_bgr;
  Mat depth;
  Mat bgr;
  Mat local_228 [96];
  Mat local_1c8 [96];
  Mat local_168 [96];
  Mat local_108 [96];
  Mat local_a8 [96];
  Scalar local_48;
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data_dir,argv[1],(allocator<char> *)&viz);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&viz,
                   &data_dir,"/rgb.png");
    cv::imread((string *)&bgr,(int)&viz);
    std::__cxx11::string::~string((string *)&viz);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&viz,
                   &data_dir,"/depth.png");
    cv::imread((string *)&depth,(int)&viz);
    std::__cxx11::string::~string((string *)&viz);
    if ((_depth & 0xfff) == 2) {
      _viz = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&depth,(int)&viz,1.0,0.0);
      local_670[0] = 0x7ff8000000000000;
      _depth_normalized = -0x3efdfffa;
      cv::operator==(&viz,0.0);
      cv::_InputArray::_InputArray((_InputArray *)&depth_bgr,(MatExpr *)&viz);
      cv::Mat::setTo((_InputArray *)&depth,(_InputArray *)&depth_normalized);
      cv::MatExpr::~MatExpr((MatExpr *)&viz);
      _viz = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&depth,(int)&viz,0.001,0.0);
      cv::Mat::Mat(local_a8,&depth);
      imgviz::normalize((imgviz *)&depth_normalized,local_a8,0.3,1.0);
      cv::Mat::~Mat(local_a8);
      _viz = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&depth_normalized,(int)&viz,255.0,0.0);
      _viz = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&depth_normalized,(int)&viz,1.0,0.0);
      cv::Mat::Mat(local_108,&depth);
      imgviz::depthToBgr((imgviz *)&depth_bgr,local_108,0.3,1.0);
      cv::Mat::~Mat(local_108);
      cv::Mat::Mat(local_168,&bgr);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,"bgr",(allocator<char> *)local_670);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_588,"lt+",(allocator<char> *)&images);
      imgviz::textInRectangle((imgviz *)&viz,local_168,&local_568,&local_588,0,1.0,2);
      cv::Mat::operator=(&bgr,&viz);
      cv::Mat::~Mat(&viz);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_568);
      cv::Mat::~Mat(local_168);
      cv::Mat::Mat(local_1c8,&depth_normalized);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"depth_normalized",(allocator<char> *)local_670);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,"lt+",(allocator<char> *)&images);
      imgviz::textInRectangle((imgviz *)&viz,local_1c8,&local_5a8,&local_5c8,0,1.0,2);
      cv::Mat::operator=(&depth_normalized,&viz);
      cv::Mat::~Mat(&viz);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5a8);
      cv::Mat::~Mat(local_1c8);
      cv::Mat::Mat(local_228,&depth_bgr);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,"depth_bgr",(allocator<char> *)local_670);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_608,"lt+",(allocator<char> *)&images);
      imgviz::textInRectangle((imgviz *)&viz,local_228,&local_5e8,&local_608,0,1.0,2);
      cv::Mat::operator=(&depth_bgr,&viz);
      cv::Mat::~Mat(&viz);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_5e8);
      cv::Mat::~Mat(local_228);
      cv::Mat::Mat(&viz,&bgr);
      cv::Mat::Mat(local_4c0,&depth_normalized);
      cv::Mat::Mat(local_460,&depth_bgr);
      __l._M_len = 3;
      __l._M_array = &viz;
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                (&images,__l,(allocator_type *)local_670);
      lVar2 = 0xc0;
      do {
        cv::Mat::~Mat(&viz + lVar2);
        lVar2 = lVar2 + -0x60;
      } while (lVar2 != -0x60);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_620,&images);
      local_528.super_Matx<int,_2,_1>.val = (Matx<int,_2,_1>)(int  [2])0x300000001;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_48);
      local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
      local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
      local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
      local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      imgviz::tile((imgviz *)&viz,&local_620,&local_528,5,&local_48);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_620);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_670,"depth_to_bgr.png",&local_671);
      local_360.sz.width = 0;
      local_360.sz.height = 0;
      local_360.flags = 0x1010000;
      local_638._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_638._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_638._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_360.obj = (imgviz *)&viz;
      cv::imwrite((string *)local_670,&local_360,(vector *)&local_638);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_638);
      std::__cxx11::string::~string((string *)local_670);
      pcVar1 = getenv("CI");
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_670,*argv,(allocator<char> *)&local_638);
        local_360.sz.width = 0;
        local_360.sz.height = 0;
        local_360.flags = 0x1010000;
        local_360.obj = (imgviz *)&viz;
        cv::imshow((string *)local_670,&local_360);
        std::__cxx11::string::~string((string *)local_670);
        cv::waitKey(0);
      }
      cv::Mat::~Mat(&viz);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&images);
      cv::Mat::~Mat(&depth_bgr);
      cv::Mat::~Mat(&depth_normalized);
      cv::Mat::~Mat(&depth);
      cv::Mat::~Mat(&bgr);
      std::__cxx11::string::~string((string *)&data_dir);
      return 0;
    }
    pcVar1 = "depth.type() == CV_16UC1";
    __line = 9;
  }
  else {
    pcVar1 = "argc == 2";
    __line = 4;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/examples/depth_to_bgr.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv) {
  assert(argc == 2);

  std::string data_dir = std::string(argv[1]);
  cv::Mat bgr = cv::imread(data_dir + "/rgb.png");
  cv::Mat depth = cv::imread(data_dir + "/depth.png", -1);
  assert(depth.type() == CV_16UC1);
  depth.convertTo(depth, CV_32FC1);
  depth.setTo(NAN, depth == 0);
  depth /= 1000;

  cv::Mat depth_normalized =
      imgviz::normalize(depth, /*min_val=*/0.3, /*max_val=*/1);
  depth_normalized *= 255;
  depth_normalized.convertTo(depth_normalized, CV_8UC1);

  cv::Mat depth_bgr = imgviz::depthToBgr(depth, /*min_val=*/0.3, /*max_val=*/1);

  bgr = imgviz::textInRectangle(bgr, "bgr");
  depth_normalized =
      imgviz::textInRectangle(depth_normalized, "depth_normalized");
  depth_bgr = imgviz::textInRectangle(depth_bgr, "depth_bgr");

  std::vector<cv::Mat> images = {bgr, depth_normalized, depth_bgr};
  cv::Mat viz = imgviz::tile(images, /*shape=*/cv::Vec2i(1, 3));

  cv::imwrite("depth_to_bgr.png", viz);
  if (!std::getenv("CI")) {
    cv::imshow(argv[0], viz);
    cv::waitKey(0);
  }
}